

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.hpp
# Opt level: O0

int __thiscall pg::TSPMSolver::todo_pop(TSPMSolver *this)

{
  int iVar1;
  reference pvVar2;
  ostream *this_00;
  void *this_01;
  int node;
  TSPMSolver *this_local;
  
  pvVar2 = std::deque<int,_std::allocator<int>_>::front(&this->todo);
  iVar1 = *pvVar2;
  std::deque<int,_std::allocator<int>_>::pop_front(&this->todo);
  this->dirty[iVar1] = 0;
  if (1 < (this->super_Solver).trace) {
    this_00 = std::operator<<((this->super_Solver).logger,"pop() => ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar1);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return iVar1;
}

Assistant:

int todo_pop() {
        int node = todo.front();
        todo.pop_front();
        dirty[node] = 0;
        if (trace >= 2) logger << "pop() => " << node << std::endl;
        return node;
    }